

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileLibraryTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmMakefileLibraryTargetGenerator::WriteModuleLibraryRules
          (cmMakefileLibraryTargetGenerator *this,bool relink)

{
  cmGeneratorTarget *this_00;
  cmLocalUnixMakefileGenerator3 *pcVar1;
  char *val;
  cmLinkLineComputer *__p;
  pointer linkLineComputer_00;
  cmOutputConverter *local_228;
  cmStateSnapshot local_1b8;
  cmStateDirectory local_1a0;
  unique_ptr<cmLinkLineComputer,_std::default_delete<cmLinkLineComputer>_> local_178;
  unique_ptr<cmLinkLineComputer,_std::default_delete<cmLinkLineComputer>_> linkLineComputer;
  string local_168;
  undefined1 local_148 [8];
  string extraFlags;
  undefined1 local_120 [8];
  string linkRuleVar;
  string linkLanguage;
  undefined1 local_d8 [8];
  string linkRuleVar_1;
  string local_b0;
  char *local_90;
  char *resolveDeviceSymbols;
  const_iterator cStack_80;
  bool doDeviceLinking;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_78;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_70;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_68;
  byte local_59;
  LinkClosure *pLStack_58;
  bool hasCUDA;
  LinkClosure *closure;
  allocator<char> local_39;
  undefined1 local_38 [8];
  string cuda_lang;
  bool relink_local;
  cmMakefileLibraryTargetGenerator *this_local;
  
  cuda_lang.field_2._M_local_buf[0xf] = relink;
  if (!relink) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_38,"CUDA",&local_39);
    std::allocator<char>::~allocator(&local_39);
    pLStack_58 = cmGeneratorTarget::GetLinkClosure
                           ((this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                            GeneratorTarget,
                            &(this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                             ConfigName);
    local_70._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin(&pLStack_58->Languages);
    local_78 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end(&pLStack_58->Languages);
    local_68 = std::
               find<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::string>
                         (local_70,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    )local_78,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_38);
    cStack_80 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end(&pLStack_58->Languages);
    local_59 = __gnu_cxx::operator!=(&local_68,&stack0xffffffffffffff80);
    resolveDeviceSymbols._7_1_ = 1;
    this_00 = (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b0,"CUDA_RESOLVE_DEVICE_SYMBOLS",
               (allocator<char> *)(linkRuleVar_1.field_2._M_local_buf + 0xf));
    val = cmGeneratorTarget::GetProperty(this_00,&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::allocator<char>::~allocator((allocator<char> *)(linkRuleVar_1.field_2._M_local_buf + 0xf));
    local_90 = val;
    if (val != (char *)0x0) {
      resolveDeviceSymbols._7_1_ = cmSystemTools::IsOn(val);
    }
    if (((local_59 & 1) != 0) && ((resolveDeviceSymbols._7_1_ & 1) != 0)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_d8,"CMAKE_CUDA_DEVICE_LINK_LIBRARY",
                 (allocator<char> *)(linkLanguage.field_2._M_local_buf + 0xf));
      std::allocator<char>::~allocator((allocator<char> *)(linkLanguage.field_2._M_local_buf + 0xf))
      ;
      WriteDeviceLibraryRules
                (this,(string *)local_d8,(bool)(cuda_lang.field_2._M_local_buf[0xf] & 1));
      std::__cxx11::string::~string((string *)local_d8);
    }
    std::__cxx11::string::~string((string *)local_38);
  }
  cmGeneratorTarget::GetLinkerLanguage
            ((string *)((long)&linkRuleVar.field_2 + 8),
             (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget,
             &(this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.ConfigName);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_120,"CMAKE_",(allocator<char> *)(extraFlags.field_2._M_local_buf + 0xf)
            );
  std::allocator<char>::~allocator((allocator<char> *)(extraFlags.field_2._M_local_buf + 0xf));
  std::__cxx11::string::operator+=
            ((string *)local_120,(string *)(linkRuleVar.field_2._M_local_buf + 8));
  std::__cxx11::string::operator+=((string *)local_120,"_CREATE_SHARED_MODULE");
  std::__cxx11::string::string((string *)local_148);
  cmMakefileTargetGenerator::GetTargetLinkFlags
            (&this->super_cmMakefileTargetGenerator,(string *)local_148,
             (string *)((long)&linkRuleVar.field_2 + 8));
  pcVar1 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_168,"CMAKE_MODULE_LINKER_FLAGS",
             (allocator<char> *)
             ((long)&linkLineComputer._M_t.
                     super___uniq_ptr_impl<cmLinkLineComputer,_std::default_delete<cmLinkLineComputer>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmLinkLineComputer_*,_std::default_delete<cmLinkLineComputer>_>
                     .super__Head_base<0UL,_cmLinkLineComputer_*,_false>._M_head_impl + 7));
  cmLocalGenerator::AddConfigVariableFlags
            ((cmLocalGenerator *)pcVar1,(string *)local_148,&local_168,
             &(this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.ConfigName);
  std::__cxx11::string::~string((string *)&local_168);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&linkLineComputer._M_t.
                     super___uniq_ptr_impl<cmLinkLineComputer,_std::default_delete<cmLinkLineComputer>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmLinkLineComputer_*,_std::default_delete<cmLinkLineComputer>_>
                     .super__Head_base<0UL,_cmLinkLineComputer_*,_false>._M_head_impl + 7));
  pcVar1 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
  local_228 = (cmOutputConverter *)0x0;
  if (pcVar1 != (cmLocalUnixMakefileGenerator3 *)0x0) {
    local_228 = &(pcVar1->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                 super_cmOutputConverter;
  }
  cmLocalGenerator::GetStateSnapshot
            (&local_1b8,(cmLocalGenerator *)(this->super_cmMakefileTargetGenerator).LocalGenerator);
  cmStateSnapshot::GetDirectory(&local_1a0,&local_1b8);
  __p = cmMakefileTargetGenerator::CreateLinkLineComputer
                  (&this->super_cmMakefileTargetGenerator,local_228,&local_1a0);
  std::unique_ptr<cmLinkLineComputer,std::default_delete<cmLinkLineComputer>>::
  unique_ptr<std::default_delete<cmLinkLineComputer>,void>
            ((unique_ptr<cmLinkLineComputer,std::default_delete<cmLinkLineComputer>> *)&local_178,
             __p);
  linkLineComputer_00 =
       std::unique_ptr<cmLinkLineComputer,_std::default_delete<cmLinkLineComputer>_>::get
                 (&local_178);
  cmCommonTargetGenerator::AddModuleDefinitionFlag
            ((cmCommonTargetGenerator *)this,linkLineComputer_00,(string *)local_148);
  WriteLibraryRules(this,(string *)local_120,(string *)local_148,
                    (bool)(cuda_lang.field_2._M_local_buf[0xf] & 1));
  std::unique_ptr<cmLinkLineComputer,_std::default_delete<cmLinkLineComputer>_>::~unique_ptr
            (&local_178);
  std::__cxx11::string::~string((string *)local_148);
  std::__cxx11::string::~string((string *)local_120);
  std::__cxx11::string::~string((string *)(linkRuleVar.field_2._M_local_buf + 8));
  return;
}

Assistant:

void cmMakefileLibraryTargetGenerator::WriteModuleLibraryRules(bool relink)
{

  if (!relink) {
    const std::string cuda_lang("CUDA");
    cmGeneratorTarget::LinkClosure const* closure =
      this->GeneratorTarget->GetLinkClosure(this->ConfigName);

    const bool hasCUDA =
      (std::find(closure->Languages.begin(), closure->Languages.end(),
                 cuda_lang) != closure->Languages.end());
    bool doDeviceLinking = true;
    if (const char* resolveDeviceSymbols =
          this->GeneratorTarget->GetProperty("CUDA_RESOLVE_DEVICE_SYMBOLS")) {
      doDeviceLinking = cmSystemTools::IsOn(resolveDeviceSymbols);
    }
    if (hasCUDA && doDeviceLinking) {
      std::string linkRuleVar = "CMAKE_CUDA_DEVICE_LINK_LIBRARY";
      this->WriteDeviceLibraryRules(linkRuleVar, relink);
    }
  }

  std::string linkLanguage =
    this->GeneratorTarget->GetLinkerLanguage(this->ConfigName);
  std::string linkRuleVar = "CMAKE_";
  linkRuleVar += linkLanguage;
  linkRuleVar += "_CREATE_SHARED_MODULE";

  std::string extraFlags;
  this->GetTargetLinkFlags(extraFlags, linkLanguage);
  this->LocalGenerator->AddConfigVariableFlags(
    extraFlags, "CMAKE_MODULE_LINKER_FLAGS", this->ConfigName);

  std::unique_ptr<cmLinkLineComputer> linkLineComputer(
    this->CreateLinkLineComputer(
      this->LocalGenerator,
      this->LocalGenerator->GetStateSnapshot().GetDirectory()));

  this->AddModuleDefinitionFlag(linkLineComputer.get(), extraFlags);

  this->WriteLibraryRules(linkRuleVar, extraFlags, relink);
}